

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_classes.h
# Opt level: O3

void cppcms::serialization_traits<mydata,_void>::save
               (serializable_base *real_object,string *serialized_object)

{
  archive a;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  archive local_50 [56];
  
  cppcms::archive::archive(local_50);
  (*real_object->_vptr_serializable_base[1])(real_object,local_50);
  cppcms::archive::str_abi_cxx11_();
  std::__cxx11::string::operator=((string *)serialized_object,(string *)local_70);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  cppcms::archive::~archive(local_50);
  return;
}

Assistant:

static void save(serializable_base const &real_object,std::string &serialized_object)
		{
			archive a;
			real_object.save(a);
			serialized_object = a.str();
		}